

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void MultiplicationHelper<unsigned_char,_unsigned_long_long,_8>::
     MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uchar *t,unsigned_long_long *u,uchar *ret)

{
  uint32_t tmp;
  uint64_t u1;
  uint32_t local_1c;
  unsigned_long_long local_18;
  
  local_18 = *u;
  local_1c = 0;
  LargeIntRegMultiply<unsigned_int,_unsigned_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((uint)*t,&local_18,&local_1c);
  SafeCastHelper<unsigned_char,_unsigned_int,_2>::
  CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(local_1c,ret);
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void MultiplyThrow(const T& t, const U& u, T& ret) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<U>::isUint64, "U must be Uint64");
        std::uint64_t u1 = u;
        std::uint32_t tmp = 0;

        LargeIntRegMultiply< std::uint32_t, std::uint64_t >::template RegMultiplyThrow< E >( t, u1, &tmp );
        SafeCastHelper< T, std::uint32_t, GetCastMethod< T, std::uint32_t >::method >::template CastThrow< E >(tmp, ret);
    }